

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *
tinyusdz::prim::anon_unknown_0::ConvertToAnimatable<tinyusdz::value::normal3f>
          (optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *__return_storage_ptr__,
          PrimVar *var)

{
  double t;
  bool bVar1;
  TimeSamples *pTVar2;
  Sample *pSVar3;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *this;
  value_type *pvVar4;
  optional<tinyusdz::value::normal3f> local_a8;
  undefined1 local_98 [8];
  optional<tinyusdz::value::normal3f> pv_1;
  Sample *s;
  size_t i;
  undefined1 local_64 [8];
  optional<tinyusdz::value::normal3f> pv;
  bool ok;
  undefined1 local_48 [8];
  Animatable<tinyusdz::value::normal3f> dst;
  PrimVar *var_local;
  
  dst._ts._24_8_ = var;
  Animatable<tinyusdz::value::normal3f>::Animatable
            ((Animatable<tinyusdz::value::normal3f> *)local_48);
  bVar1 = primvar::PrimVar::is_valid((PrimVar *)dst._ts._24_8_);
  if (bVar1) {
    pv.contained._7_1_ = 0;
    bVar1 = primvar::PrimVar::has_value((PrimVar *)dst._ts._24_8_);
    if (bVar1) {
      primvar::PrimVar::get_value<tinyusdz::value::normal3f>
                ((optional<tinyusdz::value::normal3f> *)((long)&i + 4),(PrimVar *)dst._ts._24_8_);
      nonstd::optional_lite::optional<tinyusdz::value::normal3f>::
      optional<tinyusdz::value::normal3f,_0>
                ((optional<tinyusdz::value::normal3f> *)local_64,
                 (optional<tinyusdz::value::normal3f> *)((long)&i + 4));
      nonstd::optional_lite::optional<tinyusdz::value::normal3f>::~optional
                ((optional<tinyusdz::value::normal3f> *)((long)&i + 4));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_64);
      if (bVar1) {
        pvVar4 = nonstd::optional_lite::optional<tinyusdz::value::normal3f>::value
                           ((optional<tinyusdz::value::normal3f> *)local_64);
        Animatable<tinyusdz::value::normal3f>::set_default
                  ((Animatable<tinyusdz::value::normal3f> *)local_48,pvVar4);
        pv.contained._7_1_ = 1;
      }
      nonstd::optional_lite::optional<tinyusdz::value::normal3f>::~optional
                ((optional<tinyusdz::value::normal3f> *)local_64);
    }
    bVar1 = primvar::PrimVar::has_timesamples((PrimVar *)dst._ts._24_8_);
    if (bVar1) {
      s = (Sample *)0x0;
      while( true ) {
        pTVar2 = primvar::PrimVar::ts_raw((PrimVar *)dst._ts._24_8_);
        pSVar3 = (Sample *)tinyusdz::value::TimeSamples::size(pTVar2);
        if (pSVar3 <= s) break;
        pTVar2 = primvar::PrimVar::ts_raw((PrimVar *)dst._ts._24_8_);
        this = tinyusdz::value::TimeSamples::get_samples(pTVar2);
        pv_1.contained._4_8_ =
             ::std::
             vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ::operator[](this,(size_type)s);
        if ((((const_reference)pv_1.contained._4_8_)->blocked & 1U) == 0) {
          tinyusdz::value::Value::get_value<tinyusdz::value::normal3f>
                    (&local_a8,&((const_reference)pv_1.contained._4_8_)->value,false);
          nonstd::optional_lite::optional<tinyusdz::value::normal3f>::
          optional<tinyusdz::value::normal3f,_0>
                    ((optional<tinyusdz::value::normal3f> *)local_98,&local_a8);
          nonstd::optional_lite::optional<tinyusdz::value::normal3f>::~optional(&local_a8);
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_98);
          if (bVar1) {
            t = *(double *)pv_1.contained._4_8_;
            pvVar4 = nonstd::optional_lite::optional<tinyusdz::value::normal3f>::value
                               ((optional<tinyusdz::value::normal3f> *)local_98);
            Animatable<tinyusdz::value::normal3f>::add_sample
                      ((Animatable<tinyusdz::value::normal3f> *)local_48,t,pvVar4);
          }
          else {
            nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::
            optional(__return_storage_ptr__);
          }
          pv.contained._9_3_ = 0;
          pv.contained._8_1_ = !bVar1;
          nonstd::optional_lite::optional<tinyusdz::value::normal3f>::~optional
                    ((optional<tinyusdz::value::normal3f> *)local_98);
          if (pv.contained._8_4_ != 0) goto LAB_002fb018;
        }
        else {
          Animatable<tinyusdz::value::normal3f>::add_blocked_sample
                    ((Animatable<tinyusdz::value::normal3f> *)local_48,
                     ((const_reference)pv_1.contained._4_8_)->t);
        }
        s = (Sample *)((long)&s->t + 1);
      }
      pv.contained._7_1_ = 1;
    }
    if ((pv.contained._7_1_ & 1) == 0) {
      nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::optional
                (__return_storage_ptr__);
      pv.contained._8_4_ = 1;
    }
    else {
      nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::
      optional<tinyusdz::Animatable<tinyusdz::value::normal3f>,_0>
                (__return_storage_ptr__,(Animatable<tinyusdz::value::normal3f> *)local_48);
      pv.contained._8_4_ = 1;
    }
  }
  else {
    nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::optional
              (__return_storage_ptr__);
    pv.contained._8_4_ = 1;
  }
LAB_002fb018:
  Animatable<tinyusdz::value::normal3f>::~Animatable
            ((Animatable<tinyusdz::value::normal3f> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static nonstd::optional<Animatable<T>> ConvertToAnimatable(const primvar::PrimVar &var)
{
  Animatable<T> dst;

  if (!var.is_valid()) {
    DCOUT("is_valid failed");
    DCOUT("has_value " << var.has_value());
    DCOUT("has_timesamples " << var.has_timesamples());
    return nonstd::nullopt;
  }

  bool ok = false;

  if (var.has_value()) {

    if (auto pv = var.get_value<T>()) {
      dst.set_default(pv.value());

      ok = true;
      //return std::move(dst);
    }
  }

  if (var.has_timesamples()) {
    for (size_t i = 0; i < var.ts_raw().size(); i++) {
      const value::TimeSamples::Sample &s = var.ts_raw().get_samples()[i];

      // Attribute Block?
      if (s.blocked) {
        dst.add_blocked_sample(s.t);
      } else if (auto pv = s.value.get_value<T>()) {
        dst.add_sample(s.t, pv.value());
      } else {
        // Type mismatch
        DCOUT(i << "/" << var.ts_raw().size() << " type mismatch.");
        return nonstd::nullopt;
      }
    }

    ok = true;
  }

  if (ok) {
    return std::move(dst);
  }

  DCOUT("???");
  return nonstd::nullopt;
}